

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O0

void __thiscall cppnet::Dispatcher::Connect(Dispatcher *this,string *ip,uint16_t port)

{
  bool bVar1;
  Task local_90;
  native_handle_type local_60;
  native_handle_type local_58;
  undefined1 local_50 [8];
  anon_class_48_3_02cd77fa task;
  uint16_t port_local;
  string *ip_local;
  Dispatcher *this_local;
  
  task.this._6_2_ = port;
  std::__cxx11::string::string((string *)local_50,(string *)ip);
  task._24_2_ = task.this._6_2_;
  task._32_8_ = this;
  local_58 = (native_handle_type)std::this_thread::get_id();
  local_60 = (this->_local_thread_id)._M_thread;
  bVar1 = std::operator==((id)local_58,(id)local_60);
  if (bVar1) {
    Connect::anon_class_48_3_02cd77fa::operator()((anon_class_48_3_02cd77fa *)local_50);
  }
  else {
    std::function<void()>::
    function<cppnet::Dispatcher::Connect(std::__cxx11::string_const&,unsigned_short)::__0&,void>
              ((function<void()> *)&local_90,(anon_class_48_3_02cd77fa *)local_50);
    PostTask(this,&local_90);
    std::function<void_()>::~function(&local_90);
  }
  Connect(std::__cxx11::string_const&,unsigned_short)::$_0::~__0((__0 *)local_50);
  return;
}

Assistant:

void Dispatcher::Connect(const std::string& ip, uint16_t port) {
    auto task = [ip, port, this]() {
        auto sock = MakeRWSocket();
        sock->SetDispatcher(shared_from_this());
        sock->SetEventActions(_event_actions);
        sock->SetCppNetBase(_cppnet_base.lock());
        sock->Connect(ip, port);
    };

    if (std::this_thread::get_id() == _local_thread_id) {
        task();

    } else {
        PostTask(task);
    }
}